

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTester.cpp
# Opt level: O0

void __thiscall HTester::testUpdate(HTester *this,int item)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  reference pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  HFactor *pHVar10;
  reference pvVar11;
  HMatrix *pHVar12;
  int in_ESI;
  long in_RDI;
  string *this_00;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double rate;
  double totalTime;
  double alphaFTRAN;
  double alphaBTRAN;
  double alpha;
  int fakeHint;
  double FTRANdsty;
  double BTRANdsty;
  double tick2;
  int rowOut;
  double myRate;
  int i;
  double tick1;
  double time;
  int columnOut;
  int columnIn;
  int ip;
  int totalInvert;
  int totalUpdate;
  double lastReportTime;
  double totalTick;
  double solTick;
  double invTick;
  double countSolve;
  double sumBTRANfull;
  double sumFTRANfull;
  double sumBTRANpack;
  double sumFTRANpack;
  int countTotal;
  int countBTRAN;
  int countFTRAN;
  int countRate;
  double sumLnRate;
  int *base;
  vector<int,_std::allocator<int>_> look;
  double row_ep_dsty;
  double column_dsty;
  HVector row_ep;
  HVector column;
  int numTot;
  int numRow;
  HTimer timer;
  HTester *in_stack_000009b0;
  undefined8 in_stack_fffffffffffff608;
  HModel *in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff618;
  int in_stack_fffffffffffff61c;
  HFactor *in_stack_fffffffffffff620;
  HVector *in_stack_fffffffffffff628;
  HModel *in_stack_fffffffffffff630;
  string *psVar17;
  HVector *in_stack_fffffffffffff638;
  HModel *in_stack_fffffffffffff640;
  HTimer *in_stack_fffffffffffff650;
  HFactor *in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff698;
  int iVar18;
  int local_80c;
  uint local_7ec;
  int local_7e8;
  int local_7e4;
  double local_7e0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  int local_798;
  int local_794;
  int local_790;
  int local_78c;
  double local_788;
  vector<int,_std::allocator<int>_> local_770;
  double local_758;
  double local_750;
  int local_744;
  vector<int,_std::allocator<int>_> local_740;
  vector<double,_std::allocator<double>_> local_728 [4];
  undefined1 local_6c8;
  int local_6c4;
  int local_68c;
  vector<double,_std::allocator<double>_> local_670 [4];
  undefined1 local_610;
  int local_60c;
  int local_5d8;
  int local_5d4;
  undefined1 local_d9;
  allocator local_d8;
  allocator local_d7;
  allocator local_d6;
  allocator local_d5 [20];
  allocator local_c1;
  string *local_c0;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  string asStack_18 [24];
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
  if (in_ESI == 5) {
    testCFT(in_stack_000009b0);
  }
  else {
    local_d9 = 1;
    local_c0 = local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_c1);
    local_c0 = local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"FT",local_d5);
    local_c0 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"PF",&local_d6);
    local_c0 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"MPF",&local_d7);
    local_c0 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"APF",&local_d8);
    local_d9 = 0;
    std::allocator<char>::~allocator((allocator<char> *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d7);
    std::allocator<char>::~allocator((allocator<char> *)&local_d6);
    std::allocator<char>::~allocator((allocator<char> *)local_d5);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    HTimer::HTimer(in_stack_fffffffffffff650);
    HTimer::reset((HTimer *)in_stack_fffffffffffff610);
    local_5d4 = HModel::getNumRow((HModel *)(in_RDI + 0x78));
    local_5d8 = HModel::getNumTot((HModel *)(in_RDI + 0x78));
    HVector::HVector((HVector *)in_stack_fffffffffffff610);
    HVector::HVector((HVector *)in_stack_fffffffffffff610);
    HVector::setup((HVector *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
    HVector::setup((HVector *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
    local_750 = 0.0;
    local_758 = 0.0;
    std::allocator<int>::allocator((allocator<int> *)0x18a4d3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,
               (size_type)in_stack_fffffffffffff628,(allocator_type *)in_stack_fffffffffffff620);
    std::allocator<int>::~allocator((allocator<int> *)0x18a4ff);
    piVar6 = HModel::getBaseIndex((HModel *)0x18a510);
    HModel::changeUpdate(in_stack_fffffffffffff610,iVar5);
    local_788 = 0.0;
    local_78c = 0;
    local_790 = 0;
    local_794 = 0;
    local_798 = 0;
    local_7a0 = 0.0;
    local_7a8 = 0.0;
    local_7b0 = 0.0;
    local_7b8 = 0.0;
    local_7c0 = 1.0;
    local_7c8 = 0.0;
    dVar13 = HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
    local_7e0 = HTimer::getTime((HTimer *)in_stack_fffffffffffff610);
    local_7e4 = 0;
    local_7e8 = 0;
    for (local_7ec = 0; (int)local_7ec < *(int *)(in_RDI + 0x28); local_7ec = local_7ec + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)(int)local_7ec)
      ;
      iVar5 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)(int)local_7ec)
      ;
      if ((iVar5 == -1) && (*pvVar7 == -1)) {
        dVar14 = HTimer::getTime((HTimer *)in_stack_fffffffffffff610);
        if (100.0 < dVar14 - local_7e0) {
          uVar8 = std::__cxx11::string::c_str();
          uVar9 = std::__cxx11::string::c_str();
          printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",dVar14,
                 ((double)(int)local_7ec * 100.0) / (double)*(int *)(in_RDI + 0x28),uVar8,uVar9);
          fflush(_stdout);
          local_7e0 = dVar14;
        }
        dVar14 = HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
        HModel::computeFactor(in_stack_fffffffffffff640);
        dVar15 = HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
        local_7c8 = (dVar15 - dVar14) + local_7c8;
        for (local_80c = 0; iVar5 = HModel::getNumRow((HModel *)(in_RDI + 0x78)), local_80c < iVar5;
            local_80c = local_80c + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_770,(long)piVar6[local_80c]);
          *pvVar7 = local_80c;
        }
        pHVar10 = HModel::getFactor((HModel *)(in_RDI + 0x78));
        iVar5 = pHVar10->FtotalX;
        pHVar10 = HModel::getFactor((HModel *)(in_RDI + 0x78));
        dVar14 = log((double)iVar5 / (double)pHVar10->BtotalX);
        local_788 = dVar14 + local_788;
        local_78c = local_78c + 1;
        local_7e8 = local_7e8 + 1;
      }
      else {
        local_7e4 = local_7e4 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_770,(long)*pvVar7);
        iVar3 = *pvVar7;
        HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
        HVector::clear((HVector *)in_stack_fffffffffffff630);
        local_6c8 = 1;
        local_744 = 1;
        iVar18 = iVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_740,0);
        *pvVar7 = iVar18;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](local_728,(long)iVar3);
        *pvVar11 = 1.0;
        pHVar10 = HModel::getFactor((HModel *)(in_RDI + 0x78));
        HFactor::btran(in_stack_fffffffffffff620,
                       (HVector *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                       (double)in_stack_fffffffffffff610);
        HVector::tight((HVector *)in_stack_fffffffffffff630);
        local_758 = local_758 * 0.95 + ((double)local_744 / (double)local_5d4) * 0.05;
        local_794 = local_794 + (uint)((double)local_744 / (double)local_5d4 < 0.1);
        HVector::clear((HVector *)in_stack_fffffffffffff630);
        local_610 = 1;
        pHVar12 = HModel::getMatrix((HModel *)(in_RDI + 0x78));
        HMatrix::collect_aj((HMatrix *)pHVar10,(HVector *)CONCAT44(iVar18,in_stack_fffffffffffff698)
                            ,(int)((ulong)pHVar12 >> 0x20),(double)in_stack_fffffffffffff688);
        in_stack_fffffffffffff688 = HModel::getFactor((HModel *)(in_RDI + 0x78));
        HFactor::ftran(in_stack_fffffffffffff620,
                       (HVector *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                       (double)in_stack_fffffffffffff610);
        HVector::tight((HVector *)in_stack_fffffffffffff630);
        local_750 = local_750 * 0.95 + ((double)local_68c / (double)local_5d4) * 0.05;
        local_790 = local_790 + (uint)((double)local_68c / (double)local_5d4 < 0.1);
        local_798 = local_798 + 1;
        local_7a0 = local_7a0 + (double)local_60c / (double)local_5d4;
        local_7a8 = local_7a8 + (double)local_6c4 / (double)local_5d4;
        local_7b0 = local_7b0 + (double)local_68c / (double)local_5d4;
        local_7b8 = local_7b8 + (double)local_744 / (double)local_5d4;
        local_7c0 = local_7c0 + 1.0;
        HModel::updateFactor
                  (in_stack_fffffffffffff630,in_stack_fffffffffffff628,
                   (HVector *)in_stack_fffffffffffff620,
                   (int *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                   in_stack_fffffffffffff610->intOption);
        HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                             (long)(int)local_7ec);
        vVar1 = *pvVar11;
        HModel::getMatrix((HModel *)(in_RDI + 0x78));
        dVar14 = HMatrix::compute_dot
                           ((HMatrix *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                            (int)((ulong)in_stack_fffffffffffff630 >> 0x20));
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](local_670,(long)iVar3);
        vVar2 = *pvVar11;
        bVar4 = diff_double((double)in_stack_fffffffffffff638,(double)in_stack_fffffffffffff630);
        if (bVar4) {
          uVar8 = std::__cxx11::string::c_str();
          uVar9 = std::__cxx11::string::c_str();
          printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",vVar1,vVar2,dVar14,uVar8,uVar9,
                 (ulong)local_7ec);
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_770,(long)iVar5);
        *pvVar7 = iVar3;
        piVar6[iVar3] = iVar5;
      }
    }
    dVar14 = HTimer::getTick((HTimer *)in_stack_fffffffffffff610);
    dVar15 = HTimer::getTime((HTimer *)in_stack_fffffffffffff610);
    dVar16 = exp(local_788 / (double)local_78c);
    uVar8 = std::__cxx11::string::c_str();
    uVar9 = std::__cxx11::string::c_str();
    printf("Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n"
           ,dVar16,((double)local_790 * 100.0) / (double)local_798,
           ((double)local_794 * 100.0) / (double)local_798,local_7a0 / local_7c0,
           local_7a8 / local_7c0,local_7b0 / local_7c0,local_7b8 / local_7c0,
           (dVar15 * local_7c8) / (dVar14 - dVar13),uVar8,uVar9,
           (ulong)(uint)(int)((double)local_7e4 / (double)(local_7e8 + -1)));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620);
    HVector::~HVector((HVector *)in_stack_fffffffffffff610);
    HVector::~HVector((HVector *)in_stack_fffffffffffff610);
    HTimer::~HTimer((HTimer *)in_stack_fffffffffffff620);
    psVar17 = local_b8;
    this_00 = asStack_18;
    do {
      this_00 = this_00 + -0x20;
      std::__cxx11::string::~string(this_00);
    } while (this_00 != psVar17);
  }
  return;
}

Assistant:

void HTester::testUpdate(int item) {
    if (item == 5) {
        testCFT();
        return;
    }

    string itemNames[] = { "", "FT", "PF", "MPF", "APF" };

    HTimer timer;
    timer.reset();
    const int numRow = model.getNumRow();
    const int numTot = model.getNumTot();
    HVector column;
    HVector row_ep;
    column.setup(numRow);
    row_ep.setup(numRow);
    double column_dsty = 0;
    double row_ep_dsty = 0;

    vector<int> look(numTot);
    int *base = model.getBaseIndex();

    model.changeUpdate(item);

    double sumLnRate = 0;
    int countRate = 0;

    int countFTRAN = 0;
    int countBTRAN = 0;
    int countTotal = 0;

    double sumFTRANpack = 0;
    double sumBTRANpack = 0;
    double sumFTRANfull = 0;
    double sumBTRANfull = 0;
    double countSolve = 1;

    double invTick = 0;
    double solTick = 0;

    double totalTick = timer.getTick();
    double lastReportTime = timer.getTime();

    int totalUpdate = 0;
    int totalInvert = 0;

    for (int ip = 0; ip < numPivot; ip++) {
        // Refactor
        int columnIn = historyIn[ip];
        int columnOut = historyOut[ip];
        if (columnIn == -1 && columnOut == -1) {
            double time = timer.getTime();
            if (time - lastReportTime > 100) {
                printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",
                        modelName.c_str(), itemNames[item].c_str(), time,
                        ((100.0 * ip) / numPivot));
                fflush(stdout);
                lastReportTime = time;
            }

            double tick1 = timer.getTick();
            model.computeFactor();
            invTick += timer.getTick() - tick1;
            for (int i = 0; i < model.getNumRow(); i++)
                look[base[i]] = i;

            double myRate = 1.0 * model.getFactor()->FtotalX
                    / model.getFactor()->BtotalX;
            sumLnRate += log(myRate);
            countRate++;

            totalInvert++;

            continue;
        }
        totalUpdate++;

        // The row out
        int rowOut = look[columnOut];

        double tick2 = timer.getTick();

        // Compute BTRAN
        row_ep.clear();
        row_ep.packFlag = true;
        row_ep.count = 1;
        row_ep.index[0] = rowOut;
        row_ep.array[rowOut] = 1;
        model.getFactor()->btran(row_ep, row_ep_dsty);
        row_ep.tight();
        double BTRANdsty = 1.0 * row_ep.count / numRow;
        row_ep_dsty = 0.95 * row_ep_dsty + 0.05 * BTRANdsty;
        countBTRAN += BTRANdsty < 0.1;

        // Compute FTRAN
        column.clear();
        column.packFlag = true;
        model.getMatrix()->collect_aj(column, columnIn, 1);
        model.getFactor()->ftran(column, column_dsty);
        column.tight();
        double FTRANdsty = 1.0 * column.count / numRow;
        column_dsty = 0.95 * column_dsty + 0.05 * FTRANdsty;
        countFTRAN += FTRANdsty < 0.1;
        countTotal++;

        sumFTRANpack += 1.0 * column.packCount / numRow;
        sumBTRANpack += 1.0 * row_ep.packCount / numRow;
        sumFTRANfull += 1.0 * column.count / numRow;
        sumBTRANfull += 1.0 * row_ep.count / numRow;
        countSolve ++;

        // Update factor
        int fakeHint;
        model.updateFactor(&column, &row_ep, &rowOut, &fakeHint);

        solTick += timer.getTick() - tick2;

        // Compare results
        double alpha = historyAlpha[ip];
        double alphaBTRAN = model.getMatrix()->compute_dot(row_ep, columnIn);
        double alphaFTRAN = column.array[rowOut];
        if (diff_double(alphaFTRAN, alphaBTRAN)) {
            printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",
                    modelName.c_str(), itemNames[item].c_str(), ip, alpha,
                    alphaFTRAN, alphaBTRAN);
        }

        // Update the basis
        look[columnIn] = rowOut;
        base[rowOut] = columnIn;
    }
    totalTick = timer.getTick() - totalTick;
    double totalTime = timer.getTime();
    double rate = exp(sumLnRate / countRate);
    printf(
            "Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n",
            modelName.c_str(), itemNames[item].c_str(), rate,
            (int) (1.0 * totalUpdate / (totalInvert - 1)),
            100.0 * countFTRAN / countTotal, 100.0 * countBTRAN / countTotal,
            sumFTRANpack / countSolve,
            sumBTRANpack / countSolve,
            sumFTRANfull / countSolve,
            sumBTRANfull / countSolve,
            totalTime * invTick / totalTick,
            totalTime * solTick / totalTick);
}